

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O0

int mbedtls_x509_csr_parse_der(mbedtls_x509_csr *csr,uchar *buf,size_t buflen)

{
  undefined1 local_60 [8];
  mbedtls_x509_buf sig_params;
  uchar *end;
  uchar *p;
  size_t len;
  uchar *puStack_28;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_csr *csr_local;
  
  puStack_28 = (uchar *)buflen;
  buflen_local = (size_t)buf;
  buf_local = (uchar *)csr;
  memset(local_60,0,0x18);
  if (((buf_local == (uchar *)0x0) || (buflen_local == 0)) || (puStack_28 == (uchar *)0x0)) {
    csr_local._4_4_ = -0x2800;
  }
  else {
    mbedtls_x509_csr_init((mbedtls_x509_csr *)buf_local);
    p = puStack_28;
    end = (uchar *)calloc(1,(size_t)puStack_28);
    if (end == (uchar *)0x0) {
      csr_local._4_4_ = -0x2880;
    }
    else {
      memcpy(end,(void *)buflen_local,(size_t)puStack_28);
      *(uchar **)(buf_local + 0x10) = end;
      *(uchar **)(buf_local + 8) = p;
      sig_params.p = end + (long)p;
      len._4_4_ = mbedtls_asn1_get_tag(&end,sig_params.p,(size_t *)&p,0x30);
      if (len._4_4_ == 0) {
        if (p == sig_params.p + -(long)end) {
          *(uchar **)(buf_local + 0x28) = end;
          len._4_4_ = mbedtls_asn1_get_tag(&end,sig_params.p,(size_t *)&p,0x30);
          if (len._4_4_ == 0) {
            sig_params.p = end + (long)p;
            *(long *)(buf_local + 0x20) = (long)sig_params.p - *(long *)(buf_local + 0x28);
            len._4_4_ = x509_csr_get_version(&end,sig_params.p,(int *)(buf_local + 0x30));
            if (len._4_4_ == 0) {
              *(int *)(buf_local + 0x30) = *(int *)(buf_local + 0x30) + 1;
              if (*(int *)(buf_local + 0x30) == 1) {
                *(uchar **)(buf_local + 0x48) = end;
                len._4_4_ = mbedtls_asn1_get_tag(&end,sig_params.p,(size_t *)&p,0x30);
                if (len._4_4_ == 0) {
                  len._4_4_ = mbedtls_x509_get_name
                                        (&end,end + (long)p,(mbedtls_x509_name *)(buf_local + 0x50))
                  ;
                  if (len._4_4_ == 0) {
                    *(long *)(buf_local + 0x40) = (long)end - *(long *)(buf_local + 0x48);
                    len._4_4_ = mbedtls_pk_parse_subpubkey
                                          (&end,sig_params.p,
                                           (mbedtls_pk_context *)(buf_local + 0x90));
                    if (len._4_4_ == 0) {
                      len._4_4_ = mbedtls_asn1_get_tag(&end,sig_params.p,(size_t *)&p,0xa0);
                      if (len._4_4_ == 0) {
                        end = p + (long)end;
                        sig_params.p = (uchar *)(*(long *)(buf_local + 0x10) +
                                                *(long *)(buf_local + 8));
                        len._4_4_ = mbedtls_x509_get_alg
                                              (&end,sig_params.p,
                                               (mbedtls_x509_buf *)(buf_local + 0xa0),
                                               (mbedtls_x509_buf *)local_60);
                        if (len._4_4_ == 0) {
                          len._4_4_ = mbedtls_x509_get_sig_alg
                                                ((mbedtls_x509_buf *)(buf_local + 0xa0),
                                                 (mbedtls_x509_buf *)local_60,
                                                 (mbedtls_md_type_t *)(buf_local + 0xd0),
                                                 (mbedtls_pk_type_t *)(buf_local + 0xd4),
                                                 (void **)(buf_local + 0xd8));
                          if (len._4_4_ == 0) {
                            len._4_4_ = mbedtls_x509_get_sig
                                                  (&end,sig_params.p,
                                                   (mbedtls_x509_buf *)(buf_local + 0xb8));
                            if (len._4_4_ == 0) {
                              if (end == sig_params.p) {
                                csr_local._4_4_ = 0;
                              }
                              else {
                                mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                                csr_local._4_4_ = -0x21e6;
                              }
                            }
                            else {
                              mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                              csr_local._4_4_ = len._4_4_;
                            }
                          }
                          else {
                            mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                            csr_local._4_4_ = -0x2600;
                          }
                        }
                        else {
                          mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                          csr_local._4_4_ = len._4_4_;
                        }
                      }
                      else {
                        mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                        csr_local._4_4_ = len._4_4_ + -0x2180;
                      }
                    }
                    else {
                      mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                      csr_local._4_4_ = len._4_4_;
                    }
                  }
                  else {
                    mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                    csr_local._4_4_ = len._4_4_;
                  }
                }
                else {
                  mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                  csr_local._4_4_ = len._4_4_ + -0x2180;
                }
              }
              else {
                mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
                csr_local._4_4_ = -0x2580;
              }
            }
            else {
              mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
              csr_local._4_4_ = len._4_4_;
            }
          }
          else {
            mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
            csr_local._4_4_ = len._4_4_ + -0x2180;
          }
        }
        else {
          mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
          csr_local._4_4_ = -0x21e6;
        }
      }
      else {
        mbedtls_x509_csr_free((mbedtls_x509_csr *)buf_local);
        csr_local._4_4_ = -0x2180;
      }
    }
  }
  return csr_local._4_4_;
}

Assistant:

int mbedtls_x509_csr_parse_der( mbedtls_x509_csr *csr,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
    mbedtls_x509_buf sig_params;

    memset( &sig_params, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Check for valid input
     */
    if( csr == NULL || buf == NULL || buflen == 0 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    mbedtls_x509_csr_init( csr );

    /*
     * first copy the raw DER data
     */
    p = mbedtls_calloc( 1, len = buflen );

    if( p == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    csr->raw.p = p;
    csr->raw.len = len;
    end = p + len;

    /*
     *  CertificationRequest ::= SEQUENCE {
     *       certificationRequestInfo CertificationRequestInfo,
     *       signatureAlgorithm AlgorithmIdentifier,
     *       signature          BIT STRING
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     *  CertificationRequestInfo ::= SEQUENCE {
     */
    csr->cri.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    csr->cri.len = end - csr->cri.p;

    /*
     *  Version  ::=  INTEGER {  v1(0) }
     */
    if( ( ret = x509_csr_get_version( &p, end, &csr->version ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    csr->version++;

    if( csr->version != 1 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    /*
     *  subject               Name
     */
    csr->subject_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &csr->subject ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    csr->subject_raw.len = p - csr->subject_raw.p;

    /*
     *  subjectPKInfo SubjectPublicKeyInfo
     */
    if( ( ret = mbedtls_pk_parse_subpubkey( &p, end, &csr->pk ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    /*
     *  attributes    [0] Attributes
     *
     *  The list of possible attributes is open-ended, though RFC 2985
     *  (PKCS#9) defines a few in section 5.4. We currently don't support any,
     *  so we just ignore them. This is a safe thing to do as the worst thing
     *  that could happen is that we issue a certificate that does not match
     *  the requester's expectations - this cannot cause a violation of our
     *  signature policies.
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_CONTEXT_SPECIFIC ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    p += len;

    end = csr->raw.p + csr->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signature            BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &csr->sig_oid, &sig_params ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_sig_alg( &csr->sig_oid, &sig_params,
                                  &csr->sig_md, &csr->sig_pk,
                                  &csr->sig_opts ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &csr->sig ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}